

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<int>::emplace_back<int_const&>(SmallVectorBase<int> *this,int *args)

{
  size_type sVar1;
  pointer piVar2;
  
  sVar1 = this->len;
  piVar2 = this->data_ + sVar1;
  if (sVar1 == this->cap) {
    piVar2 = emplaceRealloc<int_const&>(this,piVar2,args);
    return piVar2;
  }
  this->data_[sVar1] = *args;
  this->len = sVar1 + 1;
  return piVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }